

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoModeImpl.cpp
# Opt level: O0

vector<sf::VideoMode,_std::allocator<sf::VideoMode>_> *
sf::priv::VideoModeImpl::getFullscreenModes(void)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  vector<sf::VideoMode,_std::allocator<sf::VideoMode>_> *in_RDI;
  __normal_iterator<sf::VideoMode_*,_std::vector<sf::VideoMode,_std::allocator<sf::VideoMode>_>_>
  local_98;
  VideoMode *local_90;
  __normal_iterator<sf::VideoMode_*,_std::vector<sf::VideoMode,_std::allocator<sf::VideoMode>_>_>
  local_88;
  __normal_iterator<sf::VideoMode_*,_std::vector<sf::VideoMode,_std::allocator<sf::VideoMode>_>_>
  local_80;
  short local_76;
  undefined1 local_74 [6];
  Rotation currentRotation;
  VideoMode mode;
  int j;
  int i;
  int *depths;
  long lStack_50;
  int nbDepths;
  XRRScreenSize *sizes;
  long lStack_40;
  int nbSizes;
  XRRScreenConfiguration *config;
  int local_30;
  int version;
  int screen;
  Display *local_20;
  Display *display;
  vector<sf::VideoMode,_std::allocator<sf::VideoMode>_> *modes;
  
  display._7_1_ = 0;
  std::vector<sf::VideoMode,_std::allocator<sf::VideoMode>_>::vector(in_RDI);
  local_20 = OpenDisplay();
  if (local_20 == (Display *)0x0) {
    poVar4 = err();
    poVar4 = std::operator<<(poVar4,
                             "Failed to connect to the X server while trying to get the supported video modes"
                            );
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    local_30 = *(int *)(local_20 + 0xe0);
    iVar2 = XQueryExtension(local_20,"RANDR",(long)&config + 4,(long)&config + 4);
    if (iVar2 == 0) {
      poVar4 = err();
      poVar4 = std::operator<<(poVar4,
                               "Failed to use the XRandR extension while trying to get the supported video modes"
                              );
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    else {
      lStack_40 = XRRGetScreenInfo(local_20,*(undefined8 *)
                                             (*(long *)(local_20 + 0xe8) + 0x10 +
                                             (long)local_30 * 0x80));
      if (lStack_40 == 0) {
        poVar4 = err();
        poVar4 = std::operator<<(poVar4,
                                 "Failed to retrieve the screen configuration while trying to get the supported video modes"
                                );
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      else {
        lStack_50 = XRRConfigSizes(lStack_40,(long)&sizes + 4);
        if ((lStack_50 != 0) && (0 < sizes._4_4_)) {
          depths._4_4_ = 0;
          lVar3 = XListDepths(local_20,local_30,(long)&depths + 4);
          if ((lVar3 != 0) && (0 < depths._4_4_)) {
            for (mode.bitsPerPixel = 0; (int)mode.bitsPerPixel < depths._4_4_;
                mode.bitsPerPixel = mode.bitsPerPixel + 1) {
              for (mode.height = 0; (int)mode.height < sizes._4_4_; mode.height = mode.height + 1) {
                VideoMode::VideoMode
                          ((VideoMode *)local_74,
                           *(uint *)(lStack_50 + (long)(int)mode.height * 0x10),
                           *(uint *)(lStack_50 + 4 + (long)(int)mode.height * 0x10),
                           *(uint *)(lVar3 + (long)(int)mode.bitsPerPixel * 4));
                XRRConfigRotations(lStack_40,&local_76);
                if ((local_76 == 2) || (local_76 == 8)) {
                  std::swap<unsigned_int>((uint *)local_74,(uint *)(local_74 + 4));
                }
                local_88._M_current =
                     (VideoMode *)
                     std::vector<sf::VideoMode,_std::allocator<sf::VideoMode>_>::begin(in_RDI);
                local_90 = (VideoMode *)
                           std::vector<sf::VideoMode,_std::allocator<sf::VideoMode>_>::end(in_RDI);
                local_80 = std::
                           find<__gnu_cxx::__normal_iterator<sf::VideoMode*,std::vector<sf::VideoMode,std::allocator<sf::VideoMode>>>,sf::VideoMode>
                                     (local_88,(__normal_iterator<sf::VideoMode_*,_std::vector<sf::VideoMode,_std::allocator<sf::VideoMode>_>_>
                                                )local_90,(VideoMode *)local_74);
                local_98._M_current =
                     (VideoMode *)
                     std::vector<sf::VideoMode,_std::allocator<sf::VideoMode>_>::end(in_RDI);
                bVar1 = __gnu_cxx::operator==(&local_80,&local_98);
                if (bVar1) {
                  std::vector<sf::VideoMode,_std::allocator<sf::VideoMode>_>::push_back
                            (in_RDI,(value_type *)local_74);
                }
              }
            }
            XFree(lVar3);
          }
        }
        XRRFreeScreenConfigInfo(lStack_40);
      }
    }
    CloseDisplay(local_20);
  }
  return in_RDI;
}

Assistant:

std::vector<VideoMode> VideoModeImpl::getFullscreenModes()
{
    std::vector<VideoMode> modes;

    // Open a connection with the X server
    Display* display = OpenDisplay();
    if (display)
    {
        // Retrieve the default screen number
        int screen = DefaultScreen(display);

        // Check if the XRandR extension is present
        int version;
        if (XQueryExtension(display, "RANDR", &version, &version, &version))
        {
            // Get the current configuration
            XRRScreenConfiguration* config = XRRGetScreenInfo(display, RootWindow(display, screen));
            if (config)
            {
                // Get the available screen sizes
                int nbSizes;
                XRRScreenSize* sizes = XRRConfigSizes(config, &nbSizes);
                if (sizes && (nbSizes > 0))
                {
                    // Get the list of supported depths
                    int nbDepths = 0;
                    int* depths = XListDepths(display, screen, &nbDepths);
                    if (depths && (nbDepths > 0))
                    {
                        // Combine depths and sizes to fill the array of supported modes
                        for (int i = 0; i < nbDepths; ++i)
                        {
                            for (int j = 0; j < nbSizes; ++j)
                            {
                                // Convert to VideoMode
                                VideoMode mode(sizes[j].width, sizes[j].height, depths[i]);

                                Rotation currentRotation;
                                XRRConfigRotations(config, &currentRotation);

                                if (currentRotation == RR_Rotate_90 || currentRotation == RR_Rotate_270)
                                    std::swap(mode.width, mode.height);

                                // Add it only if it is not already in the array
                                if (std::find(modes.begin(), modes.end(), mode) == modes.end())
                                    modes.push_back(mode);
                            }
                        }

                        // Free the array of depths
                        XFree(depths);
                    }
                }

                // Free the configuration instance
                XRRFreeScreenConfigInfo(config);
            }
            else
            {
                // Failed to get the screen configuration
                err() << "Failed to retrieve the screen configuration while trying to get the supported video modes" << std::endl;
            }
        }
        else
        {
            // XRandr extension is not supported: we cannot get the video modes
            err() << "Failed to use the XRandR extension while trying to get the supported video modes" << std::endl;
        }

        // Close the connection with the X server
        CloseDisplay(display);
    }
    else
    {
        // We couldn't connect to the X server
        err() << "Failed to connect to the X server while trying to get the supported video modes" << std::endl;
    }

    return modes;
}